

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::PixelStoreTestCase::test(PixelStoreTestCase *this)

{
  deUint32 dVar1;
  int iVar2;
  bool bVar3;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,(ulong)(uint)this->m_initialValue);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar2 = 0x78;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    glu::CallLogWrapper::glPixelStorei
              (&(this->super_ApiCase).super_CallLogWrapper,this->m_testTargetName,
               (GLint)((ulong)dVar1 % 0xfa01));
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)dVar1 % 0xfa01);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyInteger(m_testCtx, m_testTargetName, m_initialValue);
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const int referenceValue = rnd.getInt(0, 64000);

			glPixelStorei(m_testTargetName, referenceValue);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, referenceValue);
			expectError(GL_NO_ERROR);
		}
	}